

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointlight.hpp
# Opt level: O2

Color __thiscall
PointLight::sampleIrradiance
          (PointLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *param_4)

{
  point *a;
  vec3f vVar1;
  Color CVar2;
  vec3f local_38;
  float fVar3;
  
  a = &this->position;
  vVar1 = operator-(a,surface);
  *dist = SQRT(vVar1.z * vVar1.z + vVar1.x * vVar1.x + vVar1.y * vVar1.y);
  local_38 = operator-(a,surface);
  vVar1 = normalized(&local_38);
  *dirToLight = vVar1;
  vVar1 = operator-(a,surface);
  vVar1 = operator/(&this->intensity,vVar1.x * vVar1.x + vVar1.y * vVar1.y + vVar1.z * vVar1.z);
  CVar2.x = vVar1.x;
  CVar2.y = vVar1.y;
  register0x00001240 = vVar1.z;
  return CVar2;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler&) const
	{
		dist = norm(position - surface);
		dirToLight = normalized(position - surface);
		return intensity / sqrlen(position - surface);
	}